

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

tuple<bool,_float,_cv::Mat> *
removeNoiseIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  float fVar1;
  Mat smoothened;
  _OutputArray local_110;
  _InputArray local_f8;
  Mat local_e0 [96];
  Mat local_80 [96];
  
  cv::Mat::Mat(local_80);
  cv::Mat::Mat(local_e0,inputImg);
  fVar1 = calculateNoise(local_e0);
  cv::Mat::~Mat(local_e0);
  if (fVar1 <= 50.0) {
    cv::Mat::Mat((Mat *)__return_storage_ptr__,inputImg);
  }
  else {
    local_f8.sz.width = 0;
    local_f8.sz.height = 0;
    local_f8.flags = 0x1010000;
    local_110.super__InputArray.sz.width = 0;
    local_110.super__InputArray.sz.height = 0;
    local_110.super__InputArray.flags = 0x2010000;
    local_110.super__InputArray.obj = local_80;
    local_f8.obj = inputImg;
    cv::medianBlur(&local_f8,&local_110,5);
    cv::Mat::Mat((Mat *)__return_storage_ptr__,local_80);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
  super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl = fVar1;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
  super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = fVar1 > 50.0;
  cv::Mat::~Mat(local_80);
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeNoiseIfPresent(Mat const& inputImg) {
    Mat smoothened;
    float noisePercentage = calculateNoise(inputImg);
    if (noisePercentage > 50) {
        medianBlur(inputImg, smoothened,5);
        return make_tuple(true, noisePercentage, smoothened);
    }
    return make_tuple(false,noisePercentage,inputImg);
}